

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

void uv__queue_done(uv__work *w,int err)

{
  uv_work_t *req;
  int err_local;
  uv__work *w_local;
  
  if ((w[-1].loop)->active_reqs == (void **)(w[-1].loop)->active_reqs[0]) {
    __assert_fail("uv__has_active_reqs(req->loop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/threadpool.c"
                  ,0xfc,"void uv__queue_done(struct uv__work *, int)");
  }
  (w[-2].loop)->data = w[-2].done;
  *(uv_loop_s **)(w[-2].done + 8) = w[-2].loop;
  if (w[-1].wq[1] != (void *)0x0) {
    (*(code *)w[-1].wq[1])(w[-3].wq + 1,err);
  }
  return;
}

Assistant:

static void uv__queue_done(struct uv__work* w, int err) {
  uv_work_t* req;

  req = container_of(w, uv_work_t, work_req);
  uv__req_unregister(req->loop, req);

  if (req->after_work_cb == NULL)
    return;

  req->after_work_cb(req, err);
}